

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAXException.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::SAXNotRecognizedException::SAXNotRecognizedException
          (SAXNotRecognizedException *this,XMLCh *msg,MemoryManager *manager)

{
  SAXException::SAXException(&this->super_SAXException,msg,manager);
  (this->super_SAXException)._vptr_SAXException = (_func_int **)&PTR__SAXException_00404bc8;
  return;
}

Assistant:

SAXNotRecognizedException::SAXNotRecognizedException(const XMLCh* const msg,
                                                     MemoryManager* const manager)
	: SAXException(msg, manager)
{
}